

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O2

CharFormat testing::internal::PrintCharsAsStringTo<char8_t>(char8_t *begin,size_t len,ostream *os)

{
  byte ch;
  bool bVar1;
  CharFormat CVar2;
  ostream *poVar3;
  size_t index;
  size_t sVar4;
  
  poVar3 = std::operator<<(os,"u8");
  std::operator<<(poVar3,"\"");
  bVar1 = false;
  for (sVar4 = 0; len != sVar4; sVar4 = sVar4 + 1) {
    ch = begin[sVar4];
    if (bVar1) {
      bVar1 = IsXDigit(ch);
      if (bVar1) {
        poVar3 = std::operator<<(os,"\" ");
        poVar3 = std::operator<<(poVar3,"u8");
        std::operator<<(poVar3,"\"");
      }
    }
    CVar2 = PrintAsStringLiteralTo((uint)ch,os);
    bVar1 = CVar2 == kHexEscape;
  }
  poVar3 = std::operator<<(os,"\"");
  return (CharFormat)poVar3;
}

Assistant:

static CharFormat PrintCharsAsStringTo(
    const CharType* begin, size_t len, ostream* os) {
  const char* const quote_prefix = GetCharWidthPrefix(*begin);
  *os << quote_prefix << "\"";
  bool is_previous_hex = false;
  CharFormat print_format = kAsIs;
  for (size_t index = 0; index < len; ++index) {
    const CharType cur = begin[index];
    if (is_previous_hex && IsXDigit(cur)) {
      // Previous character is of '\x..' form and this character can be
      // interpreted as another hexadecimal digit in its number. Break string to
      // disambiguate.
      *os << "\" " << quote_prefix << "\"";
    }
    is_previous_hex = PrintAsStringLiteralTo(cur, os) == kHexEscape;
    // Remember if any characters required hex escaping.
    if (is_previous_hex) {
      print_format = kHexEscape;
    }
  }
  *os << "\"";
  return print_format;
}